

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O0

int AllocateAlphaPlane(VP8Decoder *dec,VP8Io *io)

{
  void *pvVar1;
  undefined4 *in_RSI;
  long in_RDI;
  bool bVar2;
  uint64_t alpha_size;
  int height;
  int stride;
  uint local_4;
  
  pvVar1 = WebPSafeMalloc((uint64_t)in_RSI,CONCAT44(*in_RSI,in_RSI[0x21]));
  *(void **)(in_RDI + 0xbb0) = pvVar1;
  bVar2 = *(long *)(in_RDI + 0xbb0) != 0;
  if (bVar2) {
    *(undefined8 *)(in_RDI + 3000) = *(undefined8 *)(in_RDI + 0xbb0);
    *(undefined8 *)(in_RDI + 0xbc0) = 0;
  }
  local_4 = (uint)bVar2;
  return local_4;
}

Assistant:

static int AllocateAlphaPlane(VP8Decoder* const dec, const VP8Io* const io) {
  const int stride = io->width;
  const int height = io->crop_bottom;
  const uint64_t alpha_size = (uint64_t)stride * height;
  assert(dec->alpha_plane_mem_ == NULL);
  dec->alpha_plane_mem_ =
      (uint8_t*)WebPSafeMalloc(alpha_size, sizeof(*dec->alpha_plane_));
  if (dec->alpha_plane_mem_ == NULL) {
    return 0;
  }
  dec->alpha_plane_ = dec->alpha_plane_mem_;
  dec->alpha_prev_line_ = NULL;
  return 1;
}